

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O3

uint64_t __thiscall spvtools::opt::analysis::Constant::GetZeroExtendedValue(Constant *this)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  undefined4 extraout_var;
  ScalarConstant *this_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  undefined4 extraout_var_00;
  
  iVar2 = (*this->type_->_vptr_Type[10])();
  if (CONCAT44(extraout_var,iVar2) == 0) {
    __assert_fail("int_type != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                  ,0x6b,"uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
  }
  uVar1 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x24);
  if (uVar1 < 0x41) {
    iVar2 = (*this->_vptr_Constant[0xe])(this);
    this_00 = (ScalarConstant *)CONCAT44(extraout_var_00,iVar2);
    if (this_00 == (ScalarConstant *)0x0) {
      iVar2 = (*this->_vptr_Constant[0x16])(this);
      if (CONCAT44(extraout_var_01,iVar2) == 0) {
        __assert_fail("AsNullConstant() && \"Must be an integer constant.\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                      ,0x77,
                      "uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
      }
      uVar4 = 0;
    }
    else {
      if (0x20 < uVar1) {
        uVar4 = ScalarConstant::GetU64BitValue(this_00);
        return uVar4;
      }
      uVar3 = ScalarConstant::GetU32BitValue(this_00);
      uVar4 = (uint64_t)uVar3;
    }
    return uVar4;
  }
  __assert_fail("width <= 64",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/constants.cpp"
                ,0x6d,"uint64_t spvtools::opt::analysis::Constant::GetZeroExtendedValue() const");
}

Assistant:

uint64_t Constant::GetZeroExtendedValue() const {
  const auto* int_type = type()->AsInteger();
  assert(int_type != nullptr);
  const auto width = int_type->width();
  assert(width <= 64);

  uint64_t value = 0;
  if (const IntConstant* ic = AsIntConstant()) {
    if (width <= 32) {
      value = ic->GetU32BitValue();
    } else {
      value = ic->GetU64BitValue();
    }
  } else {
    assert(AsNullConstant() && "Must be an integer constant.");
  }
  return value;
}